

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O3

void __thiscall
wasm::MergeSimilarFunctions::collectEquivalentClasses
          (MergeSimilarFunctions *this,
          vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *classes,
          Module *module)

{
  pointer *pppFVar1;
  size_t *__dest;
  pointer puVar2;
  Function *pFVar3;
  iterator iVar4;
  pointer pEVar5;
  bool bVar6;
  mapped_type_conflict *__k;
  vector<wasm::Function*,std::allocator<wasm::Function*>> *this_00;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  iterator __end2;
  undefined1 auVar9 [8];
  iterator __begin2;
  pointer puVar10;
  ulong uVar11;
  long lVar12;
  initializer_list<wasm::Function_*> __l;
  initializer_list<wasm::EquivalentClass> __l_00;
  initializer_list<wasm::Function_*> __l_01;
  PassRunner local_380;
  undefined1 local_290 [8];
  map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  hashGroups;
  pointer local_188;
  pointer local_178;
  _Any_data local_158;
  _Manager_type local_148;
  undefined1 local_138 [8];
  Map hashes;
  _Any_data local_e8;
  code *local_d8;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_c8;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_b0;
  vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *local_98;
  undefined1 local_90 [8];
  vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> classesInGroup;
  EquivalentClass local_60;
  Function *local_40;
  Function *func;
  
  local_98 = classes;
  FunctionHasher::createMap((Map *)local_138,module);
  local_380.options.arguments._M_h._M_buckets = &local_380.options.arguments._M_h._M_single_bucket;
  local_380._vptr_PassRunner = (_func_int **)&PTR__PassRunner_010714e0;
  local_380.allocator = &module->allocator;
  local_380.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_380.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_380.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_380.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_380._41_8_ = 0;
  local_380.options.validate = true;
  local_380.options.validateGlobally = true;
  local_380.options.optimizeLevel = 0;
  local_380.options.shrinkLevel = 0;
  local_380.options.inlining.alwaysInlineMaxSize = 2;
  local_380.options.inlining.oneCallerInlineMaxSize = 0xffffffff;
  local_380.options.inlining.flexibleInlineMaxSize = 0x14;
  local_380.options.inlining.allowFunctionsWithLoops = false;
  local_380.options.printStackIR.
  super__Optional_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_true,_true>._M_payload.
  super__Optional_payload_base<std::basic_ostream<char,_std::char_traits<char>_>_*>._M_engaged =
       false;
  local_380.options.targetJS = false;
  local_380.options.inlining.partialInliningIfs = 0;
  local_380.options.ignoreImplicitTraps = false;
  local_380.options.trapsNeverHappen = false;
  local_380.options.lowMemoryUnused = false;
  local_380.options.fastMath = false;
  local_380.options.zeroFilledMemory = false;
  local_380.options.closedWorld = false;
  local_380.options.debugInfo = false;
  local_380.options.generateStackIR = false;
  local_380.options.optimizeStackIR = false;
  local_380.options.arguments._M_h._M_bucket_count = 1;
  local_380.options.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_380.options.arguments._M_h._M_element_count = 0;
  local_380.options.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_380.options.arguments._M_h._M_rehash_policy._M_next_resize = 0;
  local_380.options.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_380.options.passesToSkip._M_h._M_buckets =
       &local_380.options.passesToSkip._M_h._M_single_bucket;
  local_380.options.passesToSkip._M_h._M_bucket_count = 1;
  local_380.options.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_380.options.passesToSkip._M_h._M_element_count = 0;
  local_380.options.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_380.options.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  local_380.options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_380.isNested = false;
  local_380.addedPassesRemovedDWARF = false;
  hashes.
  super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&hashes.
                super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_380.wasm = module;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function
            ((function<bool_(wasm::Expression_*,_unsigned_long_&)> *)&local_e8,
             (function<bool_(wasm::Expression_*,_unsigned_long_&)> *)
             hashes.
             super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  FunctionHasher::FunctionHasher
            ((FunctionHasher *)local_290,(Map *)local_138,(ExprHasher *)&local_e8);
  WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>::
  run((WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
       *)local_290,&local_380,module);
  local_290 = (undefined1  [8])&PTR__FunctionHasher_010722f0;
  if (local_148 != (_Manager_type)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  if (local_188 != (pointer)0x0) {
    operator_delete(local_188,(long)local_178 - (long)local_188);
  }
  Pass::~Pass((Pass *)local_290);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&hashGroups;
  hashGroups._M_t._M_impl._0_4_ = 0;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  puVar10 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (puVar10 != puVar2) {
    do {
      pFVar3 = (puVar10->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar3->super_Importable).module + 8) == (char *)0x0) {
        local_60.primaryFunction = pFVar3;
        __k = std::
              map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
              ::operator[]((map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                            *)local_138,&local_60.primaryFunction);
        this_00 = (vector<wasm::Function*,std::allocator<wasm::Function*>> *)
                  std::
                  map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                  ::operator[]((map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                *)local_290,__k);
        iVar4._M_current = *(Function ***)(this_00 + 8);
        if (iVar4._M_current == *(Function ***)(this_00 + 0x10)) {
          std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
          _M_realloc_insert<wasm::Function*const&>(this_00,iVar4,&local_60.primaryFunction);
        }
        else {
          *iVar4._M_current = local_60.primaryFunction;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar2);
    p_Var8 = hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&hashGroups)
    {
      do {
        if (8 < (ulong)((long)p_Var8[1]._M_left - (long)p_Var8[1]._M_parent)) {
          pFVar3 = *(Function **)p_Var8[1]._M_parent;
          __l._M_len = 1;
          __l._M_array = &local_40;
          local_40 = pFVar3;
          std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                    (&local_b0,__l,
                     (allocator_type *)
                     &classesInGroup.
                      super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_60.primaryFunction = pFVar3;
          std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                    (&local_60.functions,&local_b0);
          __l_00._M_len = 1;
          __l_00._M_array = &local_60;
          std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::vector
                    ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)
                     local_90,__l_00,(allocator_type *)((long)&func + 7));
          if (local_60.functions.
              super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.functions.
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.functions.
                                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.functions.
                                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b0.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.
                                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.
                                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          p_Var7 = p_Var8[1]._M_parent;
          if (8 < (ulong)((long)p_Var8[1]._M_left - (long)p_Var7)) {
            uVar11 = 1;
            do {
              pEVar5 = classesInGroup.
                       super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pFVar3 = *(Function **)(&p_Var7->_M_color + uVar11 * 2);
              for (auVar9 = local_90; local_40 = pFVar3, auVar9 != (undefined1  [8])pEVar5;
                  auVar9 = (undefined1  [8])((long)auVar9 + 0x20)) {
                bVar6 = areInEquvalentClass(this,((value_type *)auVar9)->primaryFunction,pFVar3,
                                            module);
                if (bVar6) {
                  iVar4._M_current =
                       (((value_type *)auVar9)->functions).
                       super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (((value_type *)auVar9)->functions).
                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
                    _M_realloc_insert<wasm::Function*const&>
                              ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)
                               &((value_type *)auVar9)->functions,iVar4,&local_40);
                  }
                  else {
                    *iVar4._M_current = local_40;
                    pppFVar1 = &(((value_type *)auVar9)->functions).
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    *pppFVar1 = *pppFVar1 + 1;
                  }
                  goto LAB_0096984e;
                }
                pFVar3 = local_40;
              }
              __l_01._M_len = 1;
              __l_01._M_array =
                   (iterator)
                   &classesInGroup.
                    super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
              classesInGroup.
              super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pFVar3;
              std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                        (&local_c8,__l_01,(allocator_type *)((long)&func + 7));
              local_60.primaryFunction = pFVar3;
              std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                        (&local_60.functions,&local_c8);
              std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::
              emplace_back<wasm::EquivalentClass>
                        ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)
                         local_90,&local_60);
              if (local_60.functions.
                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.functions.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_60.functions.
                                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.functions.
                                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_c8.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c8.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_c8.
                                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c8.
                                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
LAB_0096984e:
              uVar11 = (ulong)((int)uVar11 + 1);
              p_Var7 = p_Var8[1]._M_parent;
            } while (uVar11 < (ulong)((long)p_Var8[1]._M_left - (long)p_Var7 >> 3));
          }
          lVar12 = (long)classesInGroup.
                         super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)local_90 >> 5;
          if (0 < lVar12) {
            uVar11 = lVar12 + 1;
            auVar9 = local_90;
            do {
              std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::push_back
                        (local_98,(value_type *)auVar9);
              auVar9 = (undefined1  [8])((long)auVar9 + 0x20);
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
          }
          std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::~vector
                    ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)
                     local_90);
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != (_Rb_tree_node_base *)&hashGroups);
    }
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
               *)local_290);
  __dest = &hashes.
            super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MergeSimilarFunctions.cpp:290:5)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  PassRunner::~PassRunner(&local_380);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
               *)local_138);
  return;
}

Assistant:

void MergeSimilarFunctions::collectEquivalentClasses(
  std::vector<EquivalentClass>& classes, Module* module) {
  auto hashes = FunctionHasher::createMap(module);
  PassRunner runner(module);

  std::function<bool(Expression*, size_t&)> ignoringConsts =
    [&](Expression* expr, size_t& digest) {
      // Ignore const's immediate operands.
      if (expr->is<Const>()) {
        return true;
      }
      // Ignore callee operands.
      if (auto* call = expr->dynCast<Call>()) {
        for (auto operand : call->operands) {
          rehash(digest,
                 ExpressionAnalyzer::flexibleHash(operand, ignoringConsts));
        }
        rehash(digest, call->isReturn);
        return true;
      }
      return false;
    };
  FunctionHasher(&hashes, ignoringConsts).run(&runner, module);

  // Find hash-equal groups.
  std::map<size_t, std::vector<Function*>> hashGroups;
  ModuleUtils::iterDefinedFunctions(
    *module, [&](Function* func) { hashGroups[hashes[func]].push_back(func); });

  for (auto& [_, hashGroup] : hashGroups) {
    if (hashGroup.size() < 2) {
      continue;
    }

    // Collect exactly equivalent functions ignoring constants.
    std::vector<EquivalentClass> classesInGroup = {
      EquivalentClass(hashGroup[0], {hashGroup[0]})};

    for (Index i = 1; i < hashGroup.size(); i++) {
      auto* func = hashGroup[i];
      bool found = false;
      for (auto& newClass : classesInGroup) {
        if (areInEquvalentClass(newClass.primaryFunction, func, module)) {
          newClass.functions.push_back(func);
          found = true;
          break;
        }
      }

      if (!found) {
        // Same hash but different instruction pattern.
        classesInGroup.push_back(EquivalentClass(func, {func}));
      }
    }
    std::copy(classesInGroup.begin(),
              classesInGroup.end(),
              std::back_inserter(classes));
  }
}